

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::RunContext::invokeActiveTestCase(RunContext *this)

{
  FatalConditionHandler fatalConditionHandler;
  FatalConditionHandler local_9;
  
  FatalConditionHandler::FatalConditionHandler(&local_9);
  (*(((this->m_activeTestCase->test).m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[4])();
  FatalConditionHandler::reset(&local_9);
  FatalConditionHandler::reset(&local_9);
  return;
}

Assistant:

void invokeActiveTestCase() {
            FatalConditionHandler fatalConditionHandler; // Handle signals
            m_activeTestCase->invoke();
            fatalConditionHandler.reset();
        }